

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void i_string_suite::i_string_UTF_16LE_with_BOM(void)

{
  char input [13];
  string_view view;
  reader reader;
  undefined4 local_178;
  value local_174;
  char local_170 [16];
  view_type local_160;
  basic_reader<char> local_150;
  
  local_160._M_str = local_170;
  local_170[8] = '\"';
  local_170[9] = '\0';
  local_170[10] = ']';
  local_170[0xb] = '\0';
  local_170[0xc] = '\0';
  local_170[0] = -1;
  local_170[1] = -2;
  local_170[2] = '[';
  local_170[3] = '\0';
  local_170[4] = '\"';
  local_170[5] = '\0';
  local_170[6] = -0x17;
  local_170[7] = '\0';
  local_160._M_len = 0xd;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_150,&local_160);
  local_174 = local_150.decoder.current.code;
  local_178 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xcc,"void i_string_suite::i_string_UTF_16LE_with_BOM()",&local_174,&local_178);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_150.stack);
  return;
}

Assistant:

void i_string_UTF_16LE_with_BOM()
{
    const char input[] = "\xFF\xFE\x5B\x00\x22\x00\xE9\x00\x22\x00\x5D\x00";
    core::detail::string_view view(input, sizeof(input)); // Capture nil character
    json::reader reader(view);
    // BOM not supported
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}